

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LinearQuantizationParams::MergeFrom
          (LinearQuantizationParams *this,LinearQuantizationParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_c1;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6a68);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->scale_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->scale_,iVar1 + (this->scale_).current_size_);
    memcpy(((this->scale_).rep_)->elements + (this->scale_).current_size_,
           ((from->scale_).rep_)->elements,(long)(from->scale_).current_size_ << 2);
    (this->scale_).current_size_ = (this->scale_).current_size_ + (from->scale_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c1,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  iVar1 = (from->bias_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->bias_,iVar1 + (this->bias_).current_size_);
    memcpy(((this->bias_).rep_)->elements + (this->bias_).current_size_,
           ((from->bias_).rep_)->elements,(long)(from->bias_).current_size_ << 2);
    (this->bias_).current_size_ = (this->bias_).current_size_ + (from->bias_).current_size_;
  }
  return;
}

Assistant:

void LinearQuantizationParams::MergeFrom(const LinearQuantizationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LinearQuantizationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  scale_.MergeFrom(from.scale_);
  bias_.MergeFrom(from.bias_);
}